

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::recomputeSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this)

{
  MultiIndexSet *mset;
  double dVar1;
  uint uVar2;
  int *piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  uint uVar8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  size_t sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  vector<int,_std::allocator<int>_> vpntr;
  bool is_complete;
  Data2D<int> dagUp;
  vector<int,_std::allocator<int>_> vindx;
  vector<double,_std::allocator<double>_> vvals;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<int,_std::allocator<int>_> local_158;
  uint local_134;
  bool local_12d;
  int local_12c;
  long local_128;
  Data2D<int> local_120;
  uint *local_f8;
  GridLocalPolynomial *local_f0;
  ulong local_e8;
  size_t local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  pointer local_98;
  long local_90;
  pointer local_88;
  ulong local_80;
  ulong local_78;
  pointer local_70;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  sVar14 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  sVar20 = (size_t)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_158,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                       )(this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,(allocator_type *)&local_d8);
  local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
  local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->surpluses).stride = sVar14;
  (this->surpluses).num_strips = sVar20;
  local_120.stride = sVar14;
  local_120.num_strips = sVar20;
  ::std::vector<double,_std::allocator<double>_>::operator=
            (&(this->surpluses).vec,(vector<double,_std::allocator<double>_> *)&local_120.vec);
  if (local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mset = &(this->super_BaseCanonicalGrid).points;
  iVar16 = (this->super_BaseCanonicalGrid).num_dimensions;
  if ((iVar16 < 3) ||
     ((iVar16 == 3 && (2000000 < (this->super_BaseCanonicalGrid).points.cache_num_indexes)))) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_120,mset);
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>(&local_158,mset);
    updateSurpluses<(TasGrid::RuleLocal::erule)3>
              (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_158,&local_120)
    ;
  }
  else {
    local_12d = true;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_120,mset,&local_12d);
    if (local_12d == false) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>(&local_158,mset);
      updateSurpluses<(TasGrid::RuleLocal::erule)3>
                (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_158,
                 &local_120);
    }
    else {
      piVar9 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar3 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar13 = piVar9 + 1;
      if (piVar13 != piVar3 && piVar9 != piVar3) {
        iVar16 = *piVar9;
        do {
          iVar19 = *piVar13;
          iVar17 = iVar16;
          if (iVar16 <= iVar19) {
            iVar17 = iVar19;
          }
          if (iVar16 < iVar19) {
            piVar9 = piVar13;
          }
          piVar13 = piVar13 + 1;
          iVar16 = iVar17;
        } while (piVar13 != piVar3);
      }
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)3>
                (this->order,*piVar9 + 1,(vector<int,_std::allocator<int>_> *)&local_158,&local_d8,
                 &local_b8);
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MultiIndexManipulations::resortIndexes(mset,&local_48,&local_68);
      local_128 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
      if (0 < local_128) {
        local_98 = local_68.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_90 = local_128;
          lVar10 = local_128 + -1;
          local_f8 = (uint *)local_68.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar10].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
          uVar8 = (int)((ulong)((long)local_68.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)local_f8) >> 2) - 1;
          if (0 < (int)uVar8) {
            local_88 = local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar10;
            sVar14 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            local_e0 = (this->surpluses).stride;
            pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar5 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            local_70 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_80 = (ulong)uVar8;
            uVar22 = 0;
            local_134 = *local_f8;
            do {
              local_78 = uVar22;
              local_e8 = (ulong)local_134;
              uVar8 = local_f8[local_78 + 1];
              if ((int)(local_134 + 1) < (int)uVar8) {
                piVar6 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_12c = piVar5[lVar10 + (long)piVar6[(int)local_134] * sVar14];
                lVar11 = (long)(int)local_134 + 1;
                do {
                  iVar16 = piVar5[lVar10 + sVar14 * (long)piVar6[lVar11]];
                  iVar19 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar16];
                  lVar21 = (long)iVar19;
                  iVar17 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21];
                  if ((iVar17 < iVar16) || (local_12c < iVar16)) {
                    lVar12 = (long)piVar6[lVar11] * local_e0;
                    uVar2 = (this->super_BaseCanonicalGrid).num_outputs;
                    uVar22 = local_e8;
                    iVar18 = local_12c;
                    do {
                      if (iVar17 < iVar18) {
                        iVar19 = iVar19 + 1;
                      }
                      else {
                        iVar15 = (int)uVar22;
                        if (iVar17 <= iVar18) {
                          if (0 < (int)uVar2) {
                            iVar17 = piVar6[iVar15];
                            dVar1 = local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar21];
                            uVar22 = 0;
                            do {
                              pdVar4[lVar12 + uVar22] =
                                   pdVar4[(long)iVar17 * local_e0 + uVar22] * -dVar1 +
                                   pdVar4[lVar12 + uVar22];
                              uVar22 = uVar22 + 1;
                            } while (uVar2 != uVar22);
                          }
                          iVar19 = iVar19 + 1;
                        }
                        uVar22 = (ulong)(iVar15 + 1);
                        iVar18 = piVar5[lVar10 + (long)piVar6[(long)iVar15 + 1] * sVar14];
                      }
                      lVar21 = (long)iVar19;
                      iVar17 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar21];
                    } while ((iVar17 < iVar16) || (iVar18 < iVar16));
                  }
                  lVar11 = lVar11 + 1;
                } while (uVar8 != (uint)lVar11);
              }
              uVar22 = local_78 + 1;
              local_134 = uVar8;
            } while (local_78 + 1 != local_80);
          }
          bVar7 = 1 < local_128;
          local_128 = lVar10;
        } while (bVar7);
      }
      local_f0 = this;
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_68);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_48);
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::recomputeSurpluses() {
    surpluses = Data2D<double>(num_outputs, points.getNumIndexes(), std::vector<double>(values.begin(), values.end()));

    // There are two available algorithms here:
    // - global sparse Kronecker (kron), implemented here in recomputeSurpluses()
    // - sparse matrix in matrix-free form (mat), implemented in updateSurpluses()
    //
    // (kron) has the additional restriction that it will only work when the hierarchy is complete
    // i.e., all point (multi-indexes) have all of their parents
    // this is guaranteed for a full-tensor grid, non-adaptive grid, or a grid adapted with the stable refinement strategy
    // other refinement strategies or using dynamic refinement (even with a stable refinement strategy)
    // may yield a hierarchy-complete grid, but this is not mathematically guaranteed
    //
    // computing the dagUp allows us to check (at runtime) if the grid is_complete, and exclude (kron) if incomplete
    //    the completeness check can be done on the fly but it does incur cost
    //
    // approximate computational cost, let n be the number of points and d be the number of dimensions
    // (kron) d n n^(1/d) due to standard Kronecker reasons, except it is hard to find the "effective" n due to sparsity
    // (mat) d^2 n log(n) since there are d log(n) ancestors and basis functions are product of d one dimensional functions
    //    naturally, there are constants and those also depend on the system, e.g., number of threads, thread scheduling, cache ...
    //    (mat) has a more even load per thread and parallelizes better
    //
    // for d = 1, the algorithms are the same, except (kron) explicitly forms the matrix and the matrix free (mat) version is much better
    // for d = 2, the (mat) algorithm is still faster
    // for d = 3, and sufficiently large size the (mat) algorithm still wins
    //            the breaking point depends on n, the order and system
    // for d = 4 and above, the (kron) algorithm is much faster
    //           it is possible that for sufficiently large n (mat) will win again
    //           but tested on 12 cores CPUs (Intel and AMD) up to n = 3.5 million, the (kron) method is over 2x faster
    // higher dimensions will favor (kron) even more

    if (num_dimensions <= 2 or (num_dimensions == 3 and points.getNumIndexes() > 2000000)) {
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    bool is_complete = true;
    Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points, is_complete);

    if (not is_complete) {
        // incomplete hierarchy, must use the slow algorithm
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    int num_nodes = 1 + *std::max_element(points.begin(), points.end());

    std::vector<int> vpntr, vindx;
    std::vector<double> vvals;
    RuleLocal::van_matrix<effrule>(order, num_nodes, vpntr, vindx, vvals);

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;
    MultiIndexManipulations::resortIndexes(points, map, lines1d);

    for(int d=num_dimensions-1; d>=0; d--) {
        #pragma omp parallel for schedule(dynamic)
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job]+1; i<lines1d[d][job+1]; i++) {
                double *row_strip = surpluses.getStrip(map[d][i]);

                int row = points.getIndex(map[d][i])[d];
                int im  = vpntr[row];
                int ijx = lines1d[d][job];
                int ix  = points.getIndex(map[d][ijx])[d];

                while(vindx[im] < row or ix < row) {
                    if (vindx[im] < ix) {
                        ++im; // move the index of the matrix pattern (missing entry)
                    } else if (ix < vindx[im]) {
                        // entry not connected, move to the next one
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    } else {
                        double const *col_strip = surpluses.getStrip(map[d][ijx]);
                        double const v = vvals[im];
                        for(int k=0; k<num_outputs; k++)
                            row_strip[k] -= v * col_strip[k];

                        ++im;
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    }
                }
            }
        }
    }
}